

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::attachClause(Solver *this,CRef cr)

{
  long *plVar1;
  uint uVar2;
  uint *puVar3;
  Watcher local_30;
  
  puVar3 = (this->ca).ra.memory;
  local_30.blocker.x = puVar3[(ulong)cr + 2];
  local_30.cref = cr;
  vec<Minisat::Solver::Watcher,_int>::push
            ((this->watches).occs.map.data + ((long)(int)puVar3[(ulong)cr + 1] ^ 1),&local_30);
  local_30.blocker.x = puVar3[(ulong)cr + 1];
  local_30.cref = cr;
  vec<Minisat::Solver::Watcher,_int>::push
            ((this->watches).occs.map.data + ((long)(int)puVar3[(ulong)cr + 2] ^ 1),&local_30);
  uVar2 = puVar3[cr];
  plVar1 = (long *)((long)&this->num_clauses + (ulong)(uVar2 & 4) * 2);
  *plVar1 = *plVar1 + 1;
  plVar1 = (long *)((long)&this->clauses_literals + (ulong)(uVar2 & 4) * 2);
  *plVar1 = *plVar1 + (ulong)(puVar3[cr] >> 5);
  return;
}

Assistant:

void Solver::attachClause(CRef cr){
    const Clause& c = ca[cr];
    assert(c.size() > 1);
    watches[~c[0]].push(Watcher(cr, c[1]));
    watches[~c[1]].push(Watcher(cr, c[0]));
    if (c.learnt()) num_learnts++, learnts_literals += c.size();
    else            num_clauses++, clauses_literals += c.size();
}